

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O0

void ihevc_inter_pred_luma_copy_w16out_ssse3
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 *puVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  undefined1 auVar6 [16];
  int offset_1;
  int offset;
  __m128i zero_8x16b;
  __m128i s3;
  WORD32 col;
  WORD32 row;
  int local_200;
  int local_1fc;
  undefined1 local_1e8 [10];
  undefined1 uStack_1de;
  undefined1 uStack_1dd;
  undefined1 uStack_1dc;
  undefined1 uStack_1db;
  undefined1 uStack_1da;
  int local_1d4;
  int local_1d0;
  long local_1b8;
  long local_1b0;
  byte local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  undefined1 uStack_134;
  undefined1 uStack_133;
  undefined1 uStack_132;
  undefined1 uStack_131;
  byte local_118;
  undefined1 uStack_117;
  undefined1 uStack_116;
  undefined1 uStack_115;
  undefined1 uStack_114;
  undefined1 uStack_113;
  undefined1 uStack_112;
  undefined1 uStack_111;
  byte local_f8;
  undefined1 uStack_f7;
  undefined1 uStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined1 uStack_f2;
  undefined1 uStack_f1;
  byte local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  undefined1 uStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  
  if (offset_1 % 2 != 0) {
    __assert_fail("(wd % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x5e8,
                  "void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  if (in_R9D % 2 != 0) {
    __assert_fail("(ht % 2 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x5e9,
                  "void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *, WORD16 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  local_1b8 = in_RSI;
  local_1b0 = in_RDI;
  if (offset_1 % 8 == 0) {
    for (local_1d0 = 0; local_1d0 < in_R9D; local_1d0 = local_1d0 + 2) {
      local_1fc = 0;
      for (local_1d4 = 0; local_1d4 < offset_1; local_1d4 = local_1d4 + 8) {
        uVar1 = *(undefined8 *)(local_1b0 + local_1fc);
        local_d8 = (byte)uVar1;
        uStack_d7 = (undefined1)((ulong)uVar1 >> 8);
        uStack_d6 = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_d5 = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_d4 = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_d3 = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_d2 = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_d1 = (undefined1)((ulong)uVar1 >> 0x38);
        local_1e8[1] = 0;
        local_1e8[0] = local_d8;
        local_1e8[2] = uStack_d7;
        local_1e8[3] = 0;
        local_1e8[4] = uStack_d6;
        local_1e8[5] = 0;
        local_1e8[6] = uStack_d5;
        local_1e8[7] = 0;
        local_1e8[8] = uStack_d4;
        local_1e8[9] = 0;
        uStack_1de = uStack_d3;
        uStack_1dd = 0;
        uStack_1dc = uStack_d2;
        uStack_1db = 0;
        uStack_1da = uStack_d1;
        auVar4._8_7_ = local_1e8._8_7_;
        auVar4._0_8_ = local_1e8._0_8_;
        auVar4[0xf] = 0;
        auVar6 = psllw(auVar4,ZEXT416(6));
        puVar5 = (undefined8 *)(local_1b8 + (long)local_1fc * 2);
        local_1e8._0_8_ = auVar6._0_8_;
        stack0xfffffffffffffe20 = auVar6._8_8_;
        *puVar5 = local_1e8._0_8_;
        puVar5[1] = stack0xfffffffffffffe20;
        uVar1 = *(undefined8 *)(local_1b0 + in_EDX + (long)local_1fc);
        local_f8 = (byte)uVar1;
        uStack_f7 = (undefined1)((ulong)uVar1 >> 8);
        uStack_f6 = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_f5 = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_f4 = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_f3 = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_f2 = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_f1 = (undefined1)((ulong)uVar1 >> 0x38);
        local_1e8[1] = 0;
        local_1e8[0] = local_f8;
        local_1e8[2] = uStack_f7;
        local_1e8[3] = 0;
        local_1e8[4] = uStack_f6;
        local_1e8[5] = 0;
        local_1e8[6] = uStack_f5;
        local_1e8[7] = 0;
        local_1e8[8] = uStack_f4;
        local_1e8[9] = 0;
        uStack_1de = uStack_f3;
        uStack_1dd = 0;
        uStack_1dc = uStack_f2;
        uStack_1db = 0;
        uStack_1da = uStack_f1;
        auVar3._8_7_ = local_1e8._8_7_;
        auVar3._0_8_ = local_1e8._0_8_;
        auVar3[0xf] = 0;
        auVar6 = psllw(auVar3,ZEXT416(6));
        puVar5 = (undefined8 *)(local_1b8 + (long)in_ECX * 2 + (long)local_1fc * 2);
        local_1e8._0_8_ = auVar6._0_8_;
        stack0xfffffffffffffe20 = auVar6._8_8_;
        *puVar5 = local_1e8._0_8_;
        puVar5[1] = stack0xfffffffffffffe20;
        local_1fc = local_1fc + 8;
      }
      local_1b0 = local_1b0 + (in_EDX << 1);
      local_1b8 = local_1b8 + (long)(in_ECX << 1) * 2;
    }
  }
  else {
    for (local_1d0 = 0; local_1d0 < in_R9D; local_1d0 = local_1d0 + 2) {
      local_200 = 0;
      for (local_1d4 = 0; local_1d4 < offset_1; local_1d4 = local_1d4 + 4) {
        uVar1 = *(undefined8 *)(local_1b0 + local_200);
        local_118 = (byte)uVar1;
        uStack_117 = (undefined1)((ulong)uVar1 >> 8);
        uStack_116 = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_115 = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_114 = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_113 = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_112 = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_111 = (undefined1)((ulong)uVar1 >> 0x38);
        local_1e8[1] = 0;
        local_1e8[0] = local_118;
        local_1e8[2] = uStack_117;
        local_1e8[3] = 0;
        local_1e8[4] = uStack_116;
        local_1e8[5] = 0;
        local_1e8[6] = uStack_115;
        local_1e8[7] = 0;
        local_1e8[8] = uStack_114;
        local_1e8[9] = 0;
        uStack_1de = uStack_113;
        uStack_1dd = 0;
        uStack_1dc = uStack_112;
        uStack_1db = 0;
        uStack_1da = uStack_111;
        auVar2._8_7_ = local_1e8._8_7_;
        auVar2._0_8_ = local_1e8._0_8_;
        auVar2[0xf] = 0;
        auVar6 = psllw(auVar2,ZEXT416(6));
        local_1e8._0_8_ = auVar6._0_8_;
        *(undefined8 *)(local_1b8 + (long)local_200 * 2) = local_1e8._0_8_;
        uVar1 = *(undefined8 *)(local_1b0 + in_EDX + (long)local_200);
        local_138 = (byte)uVar1;
        uStack_137 = (undefined1)((ulong)uVar1 >> 8);
        uStack_136 = (undefined1)((ulong)uVar1 >> 0x10);
        uStack_135 = (undefined1)((ulong)uVar1 >> 0x18);
        uStack_134 = (undefined1)((ulong)uVar1 >> 0x20);
        uStack_133 = (undefined1)((ulong)uVar1 >> 0x28);
        uStack_132 = (undefined1)((ulong)uVar1 >> 0x30);
        uStack_131 = (undefined1)((ulong)uVar1 >> 0x38);
        local_1e8[1] = 0;
        local_1e8[0] = local_138;
        local_1e8[2] = uStack_137;
        local_1e8[3] = 0;
        local_1e8[4] = uStack_136;
        local_1e8[5] = 0;
        local_1e8[6] = uStack_135;
        local_1e8[7] = 0;
        local_1e8[8] = uStack_134;
        local_1e8[9] = 0;
        uStack_1de = uStack_133;
        uStack_1dd = 0;
        uStack_1dc = uStack_132;
        uStack_1db = 0;
        uStack_1da = uStack_131;
        auVar6._8_7_ = local_1e8._8_7_;
        auVar6._0_8_ = local_1e8._0_8_;
        auVar6[0xf] = 0;
        auVar6 = psllw(auVar6,ZEXT416(6));
        local_1e8._0_8_ = auVar6._0_8_;
        *(undefined8 *)(local_1b8 + (long)in_ECX * 2 + (long)local_200 * 2) = local_1e8._0_8_;
        local_200 = local_200 + 4;
      }
      local_1b0 = local_1b0 + (in_EDX << 1);
      local_1b8 = local_1b8 + (long)(in_ECX << 1) * 2;
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_copy_w16out_ssse3(UWORD8 *pu1_src,
                                             WORD16 *pi2_dst,
                                             WORD32 src_strd,
                                             WORD32 dst_strd,
                                             WORD8 *pi1_coeff,
                                             WORD32 ht,
                                             WORD32 wd)
{
    WORD32 row, col;
    __m128i  s3, zero_8x16b;

    ASSERT(wd % 2 == 0); /* checking assumption*/
    ASSERT(ht % 2 == 0); /* checking assumption*/
    UNUSED(pi1_coeff);
    zero_8x16b = _mm_setzero_si128();
/*  outer for loop starts from here */
    if(wd % 8 == 0) /* wd = multiple of 8 case */
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < wd; col += 8)
            {
/* row =0 */
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_store_si128((__m128i *)(pi2_dst + offset), s3);

/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_store_si128((__m128i *)(pi2_dst + dst_strd + offset), s3);

                offset += 8; /* To pointer update */
            } /* inner for loop ends here(8-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer update */
            pi2_dst += 2 * dst_strd; /* pointer update */
        }
    }
    else /* wd = multiple of 4 case */
    {
        for(row = 0; row < ht; row += 2)
        {
            int offset = 0;
            for(col = 0; col < wd; col += 4)
            {
/* row =0 */
                /*load 16 pixel values from 15:0 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_storel_epi64((__m128i *)(pi2_dst + offset), s3);

/* row =1 */
                /*load 16 pixel values from 271:256 pos. relative to cur. pos.*/
                s3 = _mm_loadu_si128((__m128i *)(pu1_src + src_strd + offset)); /* pu1_src[col] */
                s3 = _mm_unpacklo_epi8(s3, zero_8x16b);

                s3 = _mm_slli_epi16(s3,  SHIFT_14_MINUS_BIT_DEPTH); /* (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH */

                /* pi2_dst[col] = (pu1_src[col] << SHIFT_14_MINUS_BIT_DEPTH); */
                _mm_storel_epi64((__m128i *)(pi2_dst + dst_strd + offset), s3);
                offset += 4; /* To pointer update */
            } /* inner for loop ends here(4-output values in single iteration) */

            pu1_src += 2 * src_strd; /* pointer update */
            pi2_dst += 2 * dst_strd; /* pointer update */
        }
    }

}